

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_tree_renderer.cpp
# Opt level: O3

void __thiscall
duckdb::TextTreeRenderer::SplitUpExtraInfo
          (TextTreeRenderer *this,
          InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *extra_info,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *result,idx_t max_lines)

{
  pointer pcVar1;
  idx_t iVar2;
  size_type sVar3;
  long lVar4;
  _Alloc_hider _Var5;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *result_00;
  size_type sVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  reference pvVar11;
  const_iterator cVar12;
  string *psVar13;
  ulong uVar14;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *item;
  pointer ppVar15;
  size_type __n;
  ulong __n_00;
  pointer ppVar16;
  undefined8 uVar17;
  int iVar18;
  TextTreeRenderer *pTVar19;
  pointer ppVar20;
  undefined8 uVar21;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__range1;
  string str;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  truncated_splits;
  undefined1 local_158 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  string local_128;
  uint local_104;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_100;
  string local_f8;
  idx_t local_d8;
  TextTreeRenderer *local_d0;
  string *local_c8;
  string *psStack_c0;
  pointer local_b8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_b0;
  ulong local_a8;
  ulong local_a0;
  pointer local_98;
  string local_90;
  string local_70;
  string local_50;
  
  if ((extra_info->map_idx)._M_h._M_element_count != 0) {
    ppVar16 = (extra_info->map).
              super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              .
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_128.field_2._8_8_ = extra_info;
    local_100 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)result;
    local_d8 = max_lines;
    local_d0 = this;
    for (ppVar15 = (extra_info->map).
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   .
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar16;
        ppVar15 = ppVar15 + 1) {
      bVar7 = Utf8Proc::IsValid((ppVar15->second)._M_dataplus._M_p,
                                (ppVar15->second)._M_string_length);
      if (!bVar7) {
        return;
      }
    }
    ExtraInfoSeparator_abi_cxx11_(&local_f8,local_d0);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>(local_100,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    ppVar15 = *(pointer *)local_128.field_2._8_8_;
    local_98 = *(pointer *)(local_128.field_2._8_8_ + 8);
    if (ppVar15 != local_98) {
      local_a0 = local_d8 >> 1;
      local_b0 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)(local_128.field_2._8_8_ + 0x18);
      bVar7 = false;
      local_a8 = 0;
      do {
        pTVar19 = (TextTreeRenderer *)(ppVar15->second)._M_dataplus._M_p;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pTVar19,
                   (pointer)((long)&(pTVar19->super_TreeRenderer)._vptr_TreeRenderer +
                            (ppVar15->second)._M_string_length));
        RemovePadding(&local_f8,pTVar19,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        iVar18 = 5;
        if (local_f8._M_string_length != 0) {
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          pcVar1 = (ppVar15->first)._M_dataplus._M_p;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar1,pcVar1 + (ppVar15->first)._M_string_length);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"__","");
          bVar8 = StringUtil::StartsWith(&local_90,&local_70);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          sVar6 = local_f8._M_string_length;
          if (bVar8) {
LAB_015a1591:
            local_104 = 0;
            bVar8 = false;
            if (bVar7) {
LAB_015a1603:
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_100);
              bVar8 = true;
            }
          }
          else {
            iVar2 = (local_d0->config).node_render_width;
            sVar3 = (ppVar15->first)._M_string_length;
            local_158._0_8_ = local_158 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_158,anon_var_dwarf_637249a + 8,anon_var_dwarf_637249a + 9);
            bVar8 = StringUtil::Contains(&local_f8,(string *)local_158);
            if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
              operator_delete((void *)local_158._0_8_);
            }
            if (bVar8 || iVar2 - 7 <= sVar3 + sVar6 + 2) {
              local_138._M_allocated_capacity = (size_type)&local_128;
              pcVar1 = (ppVar15->first)._M_dataplus._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_138,pcVar1,pcVar1 + (ppVar15->first)._M_string_length);
              ::std::__cxx11::string::append(local_138._M_local_buf);
              plVar10 = (long *)::std::__cxx11::string::_M_append
                                          (local_138._M_local_buf,(ulong)local_f8._M_dataplus._M_p);
              psVar13 = (string *)(plVar10 + 2);
              if ((string *)*plVar10 == psVar13) {
                local_158._16_8_ = (psVar13->_M_dataplus)._M_p;
                local_158._24_8_ = plVar10[3];
                local_158._0_8_ = (string *)(local_158 + 0x10);
              }
              else {
                local_158._16_8_ = (psVar13->_M_dataplus)._M_p;
                local_158._0_8_ = (string *)*plVar10;
              }
              local_158._8_8_ = plVar10[1];
              *plVar10 = (long)psVar13;
              plVar10[1] = 0;
              *(undefined1 *)(plVar10 + 2) = 0;
              ::std::__cxx11::string::operator=((string *)&local_f8,(string *)local_158);
              if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
                operator_delete((void *)local_158._0_8_);
              }
              if ((string *)local_138._M_allocated_capacity != &local_128) {
                operator_delete((void *)local_138._M_allocated_capacity);
              }
              goto LAB_015a1591;
            }
            local_138._M_allocated_capacity = (size_type)&local_128;
            pcVar1 = (ppVar15->first)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,pcVar1,pcVar1 + (ppVar15->first)._M_string_length);
            ::std::__cxx11::string::append(local_138._M_local_buf);
            plVar10 = (long *)::std::__cxx11::string::_M_append
                                        (local_138._M_local_buf,(ulong)local_f8._M_dataplus._M_p);
            psVar13 = (string *)(plVar10 + 2);
            if ((string *)*plVar10 == psVar13) {
              local_158._16_8_ = (psVar13->_M_dataplus)._M_p;
              local_158._24_8_ = plVar10[3];
              local_158._0_8_ = (string *)(local_158 + 0x10);
            }
            else {
              local_158._16_8_ = (psVar13->_M_dataplus)._M_p;
              local_158._0_8_ = (string *)*plVar10;
            }
            local_158._8_8_ = plVar10[1];
            *plVar10 = (long)psVar13;
            plVar10[1] = 0;
            *(undefined1 *)(plVar10 + 2) = 0;
            ::std::__cxx11::string::operator=((string *)&local_f8,(string *)local_158);
            if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_);
            }
            if ((string *)local_138._M_allocated_capacity != &local_128) {
              operator_delete((void *)local_138._M_allocated_capacity);
            }
            local_104 = (uint)CONCAT71((int7)((ulong)psVar13 >> 8),1);
            if ((~(byte)local_a8 & bVar7) != 0) goto LAB_015a1603;
            bVar8 = false;
          }
          bVar7 = bVar8;
          iVar18 = 5;
          iVar9 = ::std::__cxx11::string::compare((char *)ppVar15);
          if (iVar9 == 0) {
            ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)local_100);
            local_158._0_8_ = local_158 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"__timing__","");
            cVar12 = ::std::
                     _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find(local_b0,(key_type *)local_158);
            if (cVar12.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                ._M_cur == (__node_type *)0x0) {
              ppVar16 = *(pointer *)(local_128.field_2._8_8_ + 8);
              ppVar20 = ppVar16;
            }
            else {
              ppVar16 = (pointer)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) * 0x40 +
                                 *(long *)local_128.field_2._8_8_);
              ppVar20 = *(pointer *)(local_128.field_2._8_8_ + 8);
            }
            if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
              operator_delete((void *)local_158._0_8_);
            }
            if (ppVar16 == ppVar20) {
              iVar18 = 4;
            }
            else {
LAB_015a196f:
              iVar18 = 4;
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)local_100);
            }
          }
          else {
            iVar9 = ::std::__cxx11::string::compare((char *)ppVar15);
            if (iVar9 == 0) {
              local_158._0_8_ = local_158 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_158,"__cardinality__","");
              cVar12 = ::std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find(local_b0,(key_type *)local_158);
              if (cVar12.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                  ._M_cur == (__node_type *)0x0) {
                ppVar16 = *(pointer *)(local_128.field_2._8_8_ + 8);
                ppVar20 = ppVar16;
              }
              else {
                ppVar16 = (pointer)(*(long *)((long)cVar12.
                                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>
                                                  ._M_cur + 0x28) * 0x40 +
                                   *(long *)local_128.field_2._8_8_);
                ppVar20 = *(pointer *)(local_128.field_2._8_8_ + 8);
              }
              if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
                operator_delete((void *)local_158._0_8_);
              }
              if (ppVar16 == ppVar20) goto LAB_015a196f;
              lVar4 = *(long *)(local_100 + 8);
              *(long *)(local_100 + 8) = lVar4 + -0x20;
              if (*(void **)(lVar4 + -0x20) != (void *)(lVar4 + -0x10)) {
                operator_delete(*(void **)(lVar4 + -0x20));
              }
            }
            else {
              local_158._0_8_ = local_158 + 0x10;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_158,anon_var_dwarf_637249a + 8,anon_var_dwarf_637249a + 9);
              StringUtil::Split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                 *)&local_138,&local_f8,(string *)local_158);
              pTVar19 = local_d0;
              result_00 = local_100;
              if ((string *)local_158._0_8_ != (string *)(local_158 + 0x10)) {
                operator_delete((void *)local_158._0_8_);
              }
              uVar17 = local_138._M_allocated_capacity;
              uVar21 = local_138._8_8_;
              if (local_d8 < (ulong)((long)(local_138._8_8_ - local_138._0_8_) >> 5)) {
                local_c8 = (string *)0x0;
                psStack_c0 = (string *)0x0;
                local_b8 = (pointer)0x0;
                if (1 < local_d8) {
                  __n = 0;
                  do {
                    pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                            *)&local_138,__n);
                    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<std::__cxx11::string>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &local_c8,pvVar11);
                    __n = __n + 1;
                  } while (local_a0 != __n);
                }
                local_158._0_8_ = local_158 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"...","");
                ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_158);
                if ((undefined1 *)local_158._0_8_ != local_158 + 0x10) {
                  operator_delete((void *)local_158._0_8_);
                }
                uVar14 = (long)(local_138._8_8_ - local_138._0_8_) >> 5;
                for (__n_00 = uVar14 - local_a0; _Var5._M_p = local_128._M_dataplus._M_p,
                    uVar21 = local_138._8_8_, uVar17 = local_138._M_allocated_capacity,
                    __n_00 < uVar14; __n_00 = __n_00 + 1) {
                  pvVar11 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                          *)&local_138,__n_00);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_c8,pvVar11);
                  uVar14 = (long)(local_138._8_8_ - local_138._0_8_) >> 5;
                }
                local_138._M_allocated_capacity = (size_type)local_c8;
                local_138._8_8_ = psStack_c0;
                local_128._M_dataplus._M_p = local_b8;
                local_158._0_8_ = uVar17;
                local_158._8_8_ = uVar21;
                local_158._16_8_ = _Var5._M_p;
                local_c8 = (string *)0x0;
                psStack_c0 = (string *)0x0;
                local_b8 = (pointer)0x0;
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)local_158);
                ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_c8);
                uVar17 = local_138._M_allocated_capacity;
                uVar21 = local_138._8_8_;
              }
              for (; uVar17 != uVar21; uVar17 = uVar17 + 0x20) {
                SplitStringBuffer(pTVar19,(string *)uVar17,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                                   *)result_00);
              }
              ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_138._M_local_buf);
              iVar18 = 0;
              bVar7 = true;
              local_a8 = (ulong)local_104;
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p);
        }
      } while (((iVar18 == 5) || (iVar18 == 0)) && (ppVar15 = ppVar15 + 1, ppVar15 != local_98));
    }
  }
  return;
}

Assistant:

void TextTreeRenderer::SplitUpExtraInfo(const InsertionOrderPreservingMap<string> &extra_info, vector<string> &result,
                                        idx_t max_lines) {
	if (extra_info.empty()) {
		return;
	}
	for (auto &item : extra_info) {
		auto &text = item.second;
		if (!Utf8Proc::IsValid(text.c_str(), text.size())) {
			return;
		}
	}
	result.push_back(ExtraInfoSeparator());

	bool requires_padding = false;
	bool was_inlined = false;
	for (auto &item : extra_info) {
		string str = RemovePadding(item.second);
		if (str.empty()) {
			continue;
		}
		bool is_inlined = false;
		if (!StringUtil::StartsWith(item.first, "__")) {
			// the name is not internal (i.e. not __text__) - so we display the name in addition to the entry
			const idx_t available_width = (config.node_render_width - 7);
			idx_t total_size = item.first.size() + str.size() + 2;
			bool is_multiline = StringUtil::Contains(str, "\n");
			if (!is_multiline && total_size < available_width) {
				// we can inline the full entry - no need for any separators unless the previous entry explicitly
				// requires it
				str = item.first + ": " + str;
				is_inlined = true;
			} else {
				str = item.first + ":\n" + str;
			}
		}
		if (is_inlined && was_inlined) {
			// we can skip the padding if we have multiple inlined entries in a row
			requires_padding = false;
		}
		if (requires_padding) {
			result.emplace_back();
		}
		// cardinality, timing and estimated cardinality are rendered separately
		// this is to allow alignment horizontally across nodes
		if (item.first == RenderTreeNode::CARDINALITY) {
			// cardinality - need to reserve space for cardinality AND timing
			result.emplace_back();
			if (extra_info.find(RenderTreeNode::TIMING) != extra_info.end()) {
				result.emplace_back();
			}
			break;
		}
		if (item.first == RenderTreeNode::ESTIMATED_CARDINALITY) {
			// estimated cardinality - reserve space for estimate
			if (extra_info.find(RenderTreeNode::CARDINALITY) != extra_info.end()) {
				// if we have a true cardinality render that instead of the estimate
				result.pop_back();
				continue;
			}
			result.emplace_back();
			break;
		}
		auto splits = StringUtil::Split(str, "\n");
		if (splits.size() > max_lines) {
			// truncate this entry
			vector<string> truncated_splits;
			for (idx_t i = 0; i < max_lines / 2; i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			truncated_splits.push_back("...");
			for (idx_t i = splits.size() - max_lines / 2; i < splits.size(); i++) {
				truncated_splits.push_back(std::move(splits[i]));
			}
			splits = std::move(truncated_splits);
		}
		for (auto &split : splits) {
			SplitStringBuffer(split, result);
		}
		requires_padding = true;
		was_inlined = is_inlined;
	}
}